

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **param_2)

{
  clock_t cVar1;
  clock_t cVar2;
  long lVar3;
  ostream *poVar4;
  undefined1 auVar5 [16];
  
  cVar1 = clock();
  testingBN();
  testing();
  testingMul();
  testingExp();
  if (1 < argc) {
    resulttest();
  }
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 3;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Seconds: ",9);
  *(uint *)(std::logic_error::what + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::logic_error::what + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  cVar2 = clock();
  lVar3 = cVar2 - cVar1;
  auVar5._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar5._0_8_ = lVar3;
  auVar5._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     (((auVar5._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) / 1000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return 0;
}

Assistant:

int main(int argc, char**) {
    uint64_t t = clock();

    try {
        testingBN();
        testing();
        testingMul();
        testingExp();
        if (argc > 1)
            resulttest();
    } catch (const std::exception& exc) {
        cerr << exc.what() << endl;
        return -1;
    }
    cout.precision(3);
    cout << "Seconds: " << fixed << static_cast<double>(clock() - t) / CLOCKS_PER_SEC << endl;
    return 0;
}